

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystemFrontend.cpp
# Opt level: O0

void __thiscall
llbuild::buildsystem::BuildSystemFrontendDelegate::cancel(BuildSystemFrontendDelegate *this)

{
  BuildSystemFrontendDelegateImpl *delegateImpl;
  BuildSystemFrontendDelegate *this_local;
  
  anon_unknown.dwarf_2b88da::BuildSystemFrontendImpl::cancel
            (*(BuildSystemFrontendImpl **)((long)this->impl + 0x30));
  return;
}

Assistant:

void BuildSystemFrontendDelegate::cancel() {
  auto delegateImpl = static_cast<BuildSystemFrontendDelegateImpl*>(impl);
  delegateImpl->frontend->cancel();
}